

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void BrotliCalculateRingBufferSize(BrotliDecoderStateInternal *s)

{
  int iVar1;
  int local_28;
  int local_24;
  int local_20;
  int output_size;
  int min_size;
  int new_ringbuffer_size;
  int window_size;
  BrotliDecoderStateInternal *s_local;
  
  output_size = 1 << ((byte)s->window_bits & 0x1f);
  if (s->ringbuffer_size == 0) {
    local_24 = 0x400;
  }
  else {
    local_24 = s->ringbuffer_size;
  }
  if ((s->ringbuffer_size != output_size) && ((*(ushort *)&s->field_0x13d0 >> 2 & 1) == 0)) {
    if (s->ringbuffer == (uint8_t *)0x0) {
      local_20 = 0;
    }
    else {
      local_20 = s->pos;
    }
    local_28 = s->meta_block_remaining_len + local_20;
    if (local_28 <= local_24) {
      local_28 = local_24;
    }
    iVar1 = output_size;
    if ((*(ushort *)&s->field_0x13d0 >> 4 & 1) != 0) {
      do {
        output_size = iVar1;
        iVar1 = output_size >> 1;
      } while (local_28 <= output_size >> 1);
    }
    s->new_ringbuffer_size = output_size;
  }
  return;
}

Assistant:

static void BROTLI_NOINLINE BrotliCalculateRingBufferSize(
    BrotliDecoderState* s) {
  int window_size = 1 << s->window_bits;
  int new_ringbuffer_size = window_size;
  /* We need at least 2 bytes of ring buffer size to get the last two
     bytes for context from there */
  int min_size = s->ringbuffer_size ? s->ringbuffer_size : 1024;
  int output_size;

  /* If maximum is already reached, no further extension is retired. */
  if (s->ringbuffer_size == window_size) {
    return;
  }

  /* Metadata blocks does not touch ring buffer. */
  if (s->is_metadata) {
    return;
  }

  if (!s->ringbuffer) {
    output_size = 0;
  } else {
    output_size = s->pos;
  }
  output_size += s->meta_block_remaining_len;
  min_size = min_size < output_size ? output_size : min_size;

  if (!!s->canny_ringbuffer_allocation) {
    /* Reduce ring buffer size to save memory when server is unscrupulous.
       In worst case memory usage might be 1.5x bigger for a short period of
       ring buffer reallocation. */
    while ((new_ringbuffer_size >> 1) >= min_size) {
      new_ringbuffer_size >>= 1;
    }
  }

  s->new_ringbuffer_size = new_ringbuffer_size;
}